

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
VulkanHppGenerator::generateProtection
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,VulkanHppGenerator *this,string *protect,bool defined)

{
  size_type sVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ulong *puVar5;
  char *__lhs;
  size_type *local_a8;
  size_type local_98;
  undefined8 uStack_90;
  ulong *local_88;
  undefined8 local_80;
  ulong local_78;
  undefined8 uStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  pair<const_char_*,_const_char_*> local_28;
  
  if (protect->_M_string_length == 0) {
    local_28.first = "";
    local_28.second = "";
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_*,_const_char_*,_true>(__return_storage_ptr__,&local_28);
  }
  else {
    __lhs = "#if !defined( ";
    if (defined) {
      __lhs = "#if defined( ";
    }
    std::operator+(&local_48,__lhs,protect);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_48," )\n");
    local_a8 = (size_type *)(pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8 == paVar4) {
      local_98 = paVar4->_M_allocated_capacity;
      uStack_90 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_a8 = &local_98;
    }
    else {
      local_98 = paVar4->_M_allocated_capacity;
    }
    sVar1 = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    std::operator+(&local_68,"#endif /*",protect);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_68,"*/\n");
    local_88 = &local_78;
    puVar5 = (ulong *)(pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5 == paVar4) {
      local_78 = paVar4->_M_allocated_capacity;
      uStack_70 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      puVar5 = local_88;
    }
    else {
      local_78 = paVar4->_M_allocated_capacity;
    }
    sVar2 = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    paVar4 = &(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar4;
    if (local_a8 == &local_98) {
      paVar4->_M_allocated_capacity = local_98;
      *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = uStack_90;
    }
    else {
      (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)local_a8;
      (__return_storage_ptr__->first).field_2._M_allocated_capacity = local_98;
    }
    (__return_storage_ptr__->first)._M_string_length = sVar1;
    local_98 = local_98 & 0xffffffffffffff00;
    paVar4 = &(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar4;
    if (puVar5 == local_88) {
      paVar4->_M_allocated_capacity = local_78;
      *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_70;
    }
    else {
      (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)puVar5;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_78;
    }
    (__return_storage_ptr__->second)._M_string_length = sVar2;
    local_80 = 0;
    local_78 = local_78 & 0xffffffffffffff00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> VulkanHppGenerator::generateProtection( std::string const & protect, bool defined ) const
{
  auto const openProtect = defined ? "#if defined( " : "#if !defined( ";
  return protect.empty() ? std::make_pair( "", "" ) : std::make_pair( openProtect + protect + " )\n", "#endif /*" + protect + "*/\n" );
}